

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPClause *this)

{
  OpenMPClauseKind OVar1;
  ulong uVar2;
  string local_78;
  allocator<char> local_51;
  string local_50 [8];
  string clause_string;
  OpenMPClause *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  OVar1 = getKind(this);
  switch(OVar1) {
  case OMPC_if:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"if ");
    break;
  case OMPC_num_threads:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"num_threads ");
    break;
  default:
    printf("The clause enum is not supported yet.\n");
    break;
  case OMPC_private:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"private ");
    break;
  case OMPC_firstprivate:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"firstprivate ");
    break;
  case OMPC_shared:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"shared ");
    break;
  case OMPC_copyin:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"copyin ");
    break;
  case OMPC_align:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"align ");
    break;
  case OMPC_allocate:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"allocate ");
    break;
  case OMPC_num_teams:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"num_teams ");
    break;
  case OMPC_thread_limit:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"thread_limit ");
    break;
  case OMPC_collapse:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"collapse ");
    break;
  case OMPC_ordered:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"ordered ");
    break;
  case OMPC_partial:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"partial ");
    break;
  case OMPC_nowait:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"nowait ");
    break;
  case OMPC_full:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"full ");
    break;
  case OMPC_order:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"order ");
    break;
  case OMPC_safelen:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"safelen ");
    break;
  case OMPC_simdlen:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"simdlen ");
    break;
  case OMPC_nontemporal:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"nontemporal ");
    break;
  case OMPC_uniform:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"uniform ");
    break;
  case OMPC_inbranch:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"inbranch ");
    break;
  case OMPC_notinbranch:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"notinbranch ");
    break;
  case OMPC_bind:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"bind ");
    break;
  case OMPC_inclusive:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"inclusive ");
    break;
  case OMPC_exclusive:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"exclusive ");
    break;
  case OMPC_copyprivate:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"copyprivate ");
    break;
  case OMPC_parallel:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"parallel ");
    break;
  case OMPC_sections:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"sections ");
    break;
  case OMPC_for:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"for ");
    break;
  case OMPC_do:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"do ");
    break;
  case OMPC_taskgroup:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"taskgroup ");
    break;
  case OMPC_allocator:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"allocator ");
    break;
  case OMPC_initializer:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"initializer ");
    break;
  case OMPC_final:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"final ");
    break;
  case OMPC_untied:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"untied ");
    break;
  case OMPC_mergeable:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"mergeable ");
    break;
  case OMPC_priority:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"priority ");
    break;
  case OMPC_detach:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"detach ");
    break;
  case OMPC_grainsize:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"grainsize ");
    break;
  case OMPC_num_tasks:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"num_tasks ");
    break;
  case OMPC_nogroup:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"nogroup ");
    break;
  case OMPC_reverse_offload:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"reverse_offload ");
    break;
  case OMPC_unified_address:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"unified_address ");
    break;
  case OMPC_unified_shared_memory:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"unified_shared_memory ");
    break;
  case OMPC_dynamic_allocators:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"dynamic_allocators ");
    break;
  case OMPC_use_device_ptr:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"use_device_ptr ");
    break;
  case OMPC_sizes:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"sizes ");
    break;
  case OMPC_use_device_addr:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"use_device_addr ");
    break;
  case OMPC_is_device_ptr:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"is_device_ptr ");
    break;
  case OMPC_has_device_addr:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"has_device_addr ");
    break;
  case OMPC_link:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"link ");
    break;
  case OMPC_acq_rel:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"acq_rel ");
    break;
  case OMPC_release:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"release ");
    break;
  case OMPC_acquire:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"acquire ");
    break;
  case OMPC_read:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"read ");
    break;
  case OMPC_write:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"write ");
    break;
  case OMPC_update:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"update ");
    break;
  case OMPC_capture:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"capture ");
    break;
  case OMPC_seq_cst:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"seq_cst ");
    break;
  case OMPC_relaxed:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"relaxed ");
    break;
  case OMPC_hint:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"hint ");
    break;
  case OMPC_destroy:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"destroy ");
    break;
  case OMPC_threads:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"threads ");
    break;
  case OMPC_simd:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"simd ");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"(",&local_51);
  std::allocator<char>::~allocator(&local_51);
  expressionToString_abi_cxx11_(&local_78,this);
  std::__cxx11::string::operator+=(local_50,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::operator+=(local_50,") ");
  uVar2 = std::__cxx11::string::size();
  if (3 < uVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_50);
  }
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPClause::toString() {

    std::string result;

    switch (this->getKind()) {
        case OMPC_allocate:
            result += "allocate ";
            break;
        case OMPC_allocator:
            result += "allocator ";
            break;
        case OMPC_private:
            result += "private ";
            break;
        case OMPC_firstprivate:
            result += "firstprivate ";
            break;
        case OMPC_shared:
            result += "shared ";
            break;
        case OMPC_num_teams:
            result += "num_teams ";
            break;
        case OMPC_num_threads:
            result += "num_threads ";
            break;
        case OMPC_thread_limit:
            result += "thread_limit ";;
            break;
        case OMPC_copyin:
            result += "copyin ";
            break;
        case OMPC_align:
            result += "align ";
            break;
        case OMPC_collapse:
            result += "collapse ";
            break;
        case OMPC_ordered:
            result += "ordered ";
            break;
        case OMPC_nowait:
            result += "nowait ";
            break;
        case OMPC_full:
            result += "full ";
            break;
        case OMPC_partial:
            result += "partial ";
            break;
        case OMPC_order:
            result += "order ";
            break;
        case OMPC_safelen:
            result += "safelen ";
            break;
        case OMPC_simdlen:
            result += "simdlen ";
            break;
        case OMPC_nontemporal:
            result += "nontemporal ";
            break;
        case OMPC_uniform:
            result += "uniform ";
            break;
        case OMPC_inbranch:
            result += "inbranch ";
            break;
        case OMPC_notinbranch:
            result += "notinbranch ";
            break;
        case OMPC_bind:
            result += "bind ";
            break; 
        case OMPC_inclusive:
            result += "inclusive ";
            break;        
        case OMPC_exclusive:
            result += "exclusive ";
            break;
        case OMPC_copyprivate:
            result += "copyprivate ";
            break;        
        case OMPC_parallel:
            result += "parallel ";
            break;
        case OMPC_sections:
            result += "sections ";
            break;
        case OMPC_initializer:
            result += "initializer ";
            break;
        case OMPC_for:
            result += "for ";
            break;
        case OMPC_do:
            result += "do ";
            break;
        case OMPC_taskgroup:
            result += "taskgroup ";
            break;
        case OMPC_if:
            result += "if ";
            break;
        case OMPC_final:
            result += "final ";
            break;
        case OMPC_untied:
            result += "untied ";
            break;
        case OMPC_mergeable:
            result += "mergeable ";
            break;
        case OMPC_priority:
            result += "priority ";
            break;
        case OMPC_detach:
            result += "detach ";
            break;
        case OMPC_reverse_offload:
            result += "reverse_offload ";
            break;
        case OMPC_unified_address:
            result += "unified_address ";
            break;
        case OMPC_unified_shared_memory:
            result += "unified_shared_memory ";
            break;
        case OMPC_dynamic_allocators:
            result += "dynamic_allocators ";
            break;
        case OMPC_use_device_ptr:
            result += "use_device_ptr ";
            break;
        case OMPC_sizes:
            result += "sizes ";
            break;
        case OMPC_use_device_addr:
            result += "use_device_addr ";
            break;
        case OMPC_is_device_ptr:
            result += "is_device_ptr ";
            break;
        case OMPC_has_device_addr:
            result += "has_device_addr ";
            break;
        case OMPC_grainsize:
            result += "grainsize ";
            break;
        case OMPC_num_tasks:
            result += "num_tasks ";
            break;
        case OMPC_nogroup:
            result += "nogroup ";
            break;
        case OMPC_link:
            result += "link ";
            break;
        case OMPC_acq_rel:
            result += "acq_rel ";
            break;
        case OMPC_release:
            result += "release ";
            break;
        case OMPC_acquire:
            result += "acquire ";
            break;
        case OMPC_read:
            result += "read ";
            break;
        case OMPC_write:
            result += "write ";
            break;
        case OMPC_update:
            result += "update ";
            break;
        case OMPC_capture:
            result += "capture ";
            break;
        case OMPC_seq_cst:
            result += "seq_cst ";
            break;
        case OMPC_relaxed:
            result += "relaxed ";
            break;
        case OMPC_hint:
            result += "hint ";
            break;
        case OMPC_threads:
            result += "threads ";
            break;
        case OMPC_simd:
            result += "simd ";
            break;
        case OMPC_destroy:
            result += "destroy ";
            break;
        default:
            printf("The clause enum is not supported yet.\n");
    }

    std::string clause_string = "(";
    clause_string += this->expressionToString();
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    }

    return result;

}